

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_prepro.h
# Opt level: O0

void __thiscall
mp::
ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::
PreprocessConstraint<mp::PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::AbsId>>>
          (ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,AbsConstraint *c,
          PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>_>
          *prepro)

{
  initializer_list<double> __l;
  initializer_list<int> __l_00;
  Var r;
  Type t;
  reference pvVar1;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_RDX;
  long in_RSI;
  VarOrConst VVar2;
  VarOrConst res;
  double ub;
  double lb;
  value_type argvar;
  undefined4 in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd4c;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffffd50;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_00;
  LinTerms *in_stack_fffffffffffffd58;
  AlgebraicExpression<mp::LinTerms> *in_stack_fffffffffffffd60;
  allocator_type *in_stack_fffffffffffffd78;
  undefined7 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd87;
  iterator in_stack_fffffffffffffd88;
  iterator piVar3;
  undefined1 *puVar4;
  double local_260;
  undefined1 local_255 [5];
  vector<int,_std::allocator<int>_> *v;
  vector<double,_std::allocator<double>_> *c_00;
  LinTerms *in_stack_fffffffffffffdc0;
  undefined1 local_211;
  undefined8 local_210;
  undefined8 *local_208;
  undefined8 local_200;
  LinearFunctionalConstraint *in_stack_fffffffffffffe28;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffffe30;
  VarOrConst local_40;
  double local_30;
  double local_28;
  value_type local_1c;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *local_18;
  
  local_18 = in_RDX;
  CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::AbsId>::GetArguments
            ((CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::AbsId> *)
             (in_RSI + 0x28));
  pvVar1 = std::array<int,_1UL>::operator[]
                     ((array<int,_1UL> *)in_stack_fffffffffffffd50,
                      CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  local_1c = *pvVar1;
  local_28 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             ::lb(in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c);
  local_30 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             ::ub(in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c);
  if (local_28 < 0.0) {
    if (0.0 < local_30) {
      local_260 = -local_28;
      this_00 = local_18;
      std::max<double>(&local_260,&local_30);
      PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>_>
      ::narrow_result_bounds
                ((PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>_>
                  *)in_stack_fffffffffffffd60,(double)in_stack_fffffffffffffd58,(double)this_00);
      t = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          ::var_type(this_00,in_stack_fffffffffffffd4c);
      PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>_>
      ::set_result_type((PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>_>
                         *)local_18,t);
    }
    else {
      local_210 = 0xbff0000000000000;
      local_208 = &local_210;
      local_200 = 1;
      puVar4 = &local_211;
      std::allocator<double>::allocator((allocator<double> *)0x205e63);
      __l._M_len = (size_type)puVar4;
      __l._M_array = in_stack_fffffffffffffd88;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),__l,
                 (allocator_type *)in_stack_fffffffffffffd78);
      local_255._1_4_ = local_1c;
      v = (vector<int,_std::allocator<int>_> *)(local_255 + 1);
      c_00 = (vector<double,_std::allocator<double>_> *)0x1;
      piVar3 = (iterator)local_255;
      std::allocator<int>::allocator((allocator<int> *)0x205eb4);
      __l_00._M_len = (size_type)puVar4;
      __l_00._M_array = piVar3;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),__l_00,
                 in_stack_fffffffffffffd78);
      LinTerms::LinTerms(in_stack_fffffffffffffdc0,c_00,v);
      AlgebraicExpression<mp::LinTerms>::AlgebraicExpression
                (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                 (double)in_stack_fffffffffffffd50);
      LinearFunctionalConstraint::LinearFunctionalConstraint
                ((LinearFunctionalConstraint *)in_stack_fffffffffffffd50,
                 (AffineExpr *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      VVar2 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              ::AssignResult2Args<mp::LinearFunctionalConstraint>
                        (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      local_40.field_1 = VVar2.field_1;
      local_40.is_v_ = VVar2.is_v_;
      LinearFunctionalConstraint::~LinearFunctionalConstraint
                ((LinearFunctionalConstraint *)in_stack_fffffffffffffd50);
      AlgebraicExpression<mp::LinTerms>::~AlgebraicExpression
                ((AlgebraicExpression<mp::LinTerms> *)0x205f6b);
      LinTerms::~LinTerms((LinTerms *)in_stack_fffffffffffffd50);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd60);
      std::allocator<int>::~allocator((allocator<int> *)0x205f8c);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd60);
      std::allocator<double>::~allocator((allocator<double> *)0x205fa6);
      r = BasicFCC<mp::FCC<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::LinearFunctionalConstraint>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::LinearFunctionalConstraint>
          ::VarOrConst::get_var(&local_40);
      PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>_>
      ::set_result_var((PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>_>
                        *)local_18,r);
    }
  }
  else {
    PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>_>
    ::set_result_var((PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>_>
                      *)local_18,local_1c);
  }
  return;
}

Assistant:

void PreprocessConstraint(
      AbsConstraint& c, PreprocessInfo& prepro) {
    const auto argvar = c.GetArguments()[0];
    const auto lb = MPD( lb(argvar) ),
        ub = MPD( ub(argvar) );
    if (lb>=0.0) {  // When result var is set, \a c is skipped
      prepro.set_result_var(argvar);
      return;
    } else if (ub<=0.0) {
      auto res = MPD( AssignResult2Args(   // create newvar = -argvar
            LinearFunctionalConstraint({ {{-1.0}, {argvar}}, 0.0 })) );
      prepro.set_result_var(res.get_var());
      return;
    }
    prepro.narrow_result_bounds(0.0, std::max(-lb, ub));
    prepro.set_result_type( MPD( var_type(argvar) ) );
  }